

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.c
# Opt level: O3

int main_test(int argc,char **argv)

{
  printf("consumed time for generating %d randoms.\n",100000000);
  test_co();
  test_oc();
  test_oo();
  test_12();
  test_seq_co();
  test_seq_oc();
  test_seq_oo();
  test_seq_12();
  return 0;
}

Assistant:

int main_test(int argc, char *argv[]) {
    int i;

    if (1 || (argc >= 2) && (strncmp(argv[1],"-s",2) == 0)) {
        printf("consumed time for generating %d randoms.\n",
               NUM_RANDS * TIC_COUNT);
        test_co();
        test_oc();
        test_oo();
        test_12();
        test_seq_co();
        test_seq_oc();
        test_seq_oo();
        test_seq_12();
    } else {
        printf("%s\n", dsfmt_get_idstring());
        printf("init_gen_rand(0) ");
        check("[1, 2)", s_genrand_close1_open2, s_fill_array_close1_open2,
              sst_genrand_close1_open2, sst_fill_array_close1_open2, 0, 1000);
        for (i = 0; i < 20; i++) {
            printf("init_gen_rand(%d) ", i);
            switch (i % 4) {
                case 0:
                    check("[0, 1)", s_genrand_close_open, s_fill_array_close_open,
                          sst_genrand_close_open, sst_fill_array_close_open, i, 12);
                    break;
                case 1:
                    check("(0, 1]", s_genrand_open_close, s_fill_array_open_close,
                          sst_genrand_open_close, sst_fill_array_open_close, i, 12);
                    break;
                case 2:
                    check("(0, 1)", s_genrand_open_open, s_fill_array_open_open,
                          sst_genrand_open_open, sst_fill_array_open_open, i, 12);
                    break;
                case 3:
                default:
                    check("[1, 2)", s_genrand_close1_open2,
                          s_fill_array_close1_open2,
                          sst_genrand_close1_open2,
                          sst_fill_array_close1_open2, i, 12);
            }
        }
        printf("init_by_array {1, 2, 3, 4} ");
        check_ar("[1, 2)", s_genrand_close1_open2,
                 s_fill_array_close1_open2,
                 sst_genrand_close1_open2,
                 sst_fill_array_close1_open2,
                 1000);
    }
    return 0;
}